

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.h
# Opt level: O0

void __thiscall
Js::JavascriptWeakMap::
Map<Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::GetChildren()::__0>
          (JavascriptWeakMap *this,anon_class_8_1_8991fb9c fn)

{
  anon_class_16_2_e8808043_for_fn fn_00;
  JavascriptWeakMap *this_local;
  anon_class_8_1_8991fb9c fn_local;
  
  fn_00.fn = (anon_class_8_1_8991fb9c *)&this_local;
  fn_00.this = this;
  this_local = (JavascriptWeakMap *)fn.this;
  JsUtil::
  WeakReferenceRegionKeyDictionary<Js::RecyclableObject*,bool,RecyclerPointerComparer,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::NoResizeLock>
  ::
  Map<Js::JavascriptWeakMap::Map<Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::GetChildren()::__0>(Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::GetChildren()::__0)::_lambda(Js::RecyclableObject*,bool,Memory::RecyclerWeakReferenceRegionItem<Js::RecyclableObject*>const&)_1_>
            ((WeakReferenceRegionKeyDictionary<Js::RecyclableObject*,bool,RecyclerPointerComparer,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::NoResizeLock>
              *)&this->keySet,fn_00);
  return;
}

Assistant:

void Map(Fn fn)
        {
            return keySet.Map([&](RecyclableObject* key, bool, WeakType)
            {
                Var value = nullptr;
                WeakMapKeyMap* keyMap = GetWeakMapKeyMapFromKey(key);

                // It may be the case that a CustomExternalObject (CEO) was reset, removing its WeakMapKeyMap.
                // In this case it can still be in the keySet. The keyMap may be null because of the reset,
                // but it could be reinstated if the CEO was added to another WeakMap. Thus it could also be the case that
                // this WeakMap's ID is not in the WeakMapKeyMap returned from the key object. Ignore the
                // CEO key object in these two cases.
                if (keyMap != nullptr && keyMap->ContainsKey(GetWeakMapId()))
                {
                    KeyMapGet(keyMap, &value);
                    fn(key, value);
                }
            });
        }